

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O3

SquareMatrix3<double> * __thiscall
OpenMD::SquareMatrix3<double>::inverse
          (SquareMatrix3<double> *__return_storage_ptr__,SquareMatrix3<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  uint i;
  long lVar10;
  double (*padVar11) [3];
  uint j;
  long lVar12;
  double dVar13;
  
  dVar13 = determinant(this);
  dVar1 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1];
  dVar2 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0];
  dVar3 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1];
  dVar4 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1];
  dVar5 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2];
  dVar6 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2];
  dVar7 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0];
  dVar8 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2];
  dVar9 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0];
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [0] = dVar1 * dVar5 - dVar6 * dVar4;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [1] = dVar8 * dVar4 - dVar5 * dVar3;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [0] = dVar9 * dVar4 - dVar1 * dVar7;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [1] = dVar7 * dVar3 - dVar4 * dVar2;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [2] = dVar3 * dVar6 - dVar1 * dVar8;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [0] = dVar6 * dVar7 - dVar5 * dVar9;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [1] = dVar2 * dVar5 - dVar8 * dVar7;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [2] = dVar9 * dVar8 - dVar6 * dVar2;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [2] = dVar2 * dVar1 - dVar9 * dVar3;
  lVar10 = 0;
  padVar11 = (double (*) [3])__return_storage_ptr__;
  do {
    lVar12 = 0;
    do {
      (((SquareMatrix<double,_3> *)*padVar11)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar12] =
           (((SquareMatrix<double,_3> *)*padVar11)->super_RectMatrix<double,_3U,_3U>).data_[0]
           [lVar12] / dVar13;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar10 = lVar10 + 1;
    padVar11 = padVar11 + 1;
  } while (lVar10 != 3);
  return __return_storage_ptr__;
}

Assistant:

SquareMatrix3<Real> inverse() const {
      SquareMatrix3<Real> m;
      RealType det = determinant();
      m(0, 0)      = this->data_[1][1] * this->data_[2][2] -
                this->data_[1][2] * this->data_[2][1];
      m(1, 0) = this->data_[1][2] * this->data_[2][0] -
                this->data_[1][0] * this->data_[2][2];
      m(2, 0) = this->data_[1][0] * this->data_[2][1] -
                this->data_[1][1] * this->data_[2][0];
      m(0, 1) = this->data_[2][1] * this->data_[0][2] -
                this->data_[2][2] * this->data_[0][1];
      m(1, 1) = this->data_[2][2] * this->data_[0][0] -
                this->data_[2][0] * this->data_[0][2];
      m(2, 1) = this->data_[2][0] * this->data_[0][1] -
                this->data_[2][1] * this->data_[0][0];
      m(0, 2) = this->data_[0][1] * this->data_[1][2] -
                this->data_[0][2] * this->data_[1][1];
      m(1, 2) = this->data_[0][2] * this->data_[1][0] -
                this->data_[0][0] * this->data_[1][2];
      m(2, 2) = this->data_[0][0] * this->data_[1][1] -
                this->data_[0][1] * this->data_[1][0];
      m /= det;
      return m;
    }